

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O2

void cursespp::SchemaOverlay::ShowBoolOverlay
               (BoolEntry *entry,PrefsPtr *prefs,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *callback)

{
  Type TVar1;
  double value;
  char cVar2;
  int iVar3;
  __0 *this;
  runtime_error *this_00;
  long lVar4;
  char *__s;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_15a;
  allocator<char> local_159;
  __shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> local_158;
  allocator<char> local_148 [32];
  allocator<char> local_128 [32];
  string local_108;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  __shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> local_c8;
  anon_class_80_3_1ce9ae6c handler;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  string name;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,(entry->entry).name,(allocator<char> *)&handler);
  std::__cxx11::string::string<std::allocator<char>>((string *)&handler,"true",local_148);
  __s = "false";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)handler.name.field_2._M_local_buf,"false",local_128);
  __l._M_len = 2;
  __l._M_array = (iterator)&handler;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&items,__l,(allocator_type *)&local_158);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&handler.prefs.
                       super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> *)&handler,
             &prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&handler.name,(string *)&name);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function(&handler.callback,callback);
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c8,
             &prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_158,&local_c8);
  TVar1 = (entry->entry).type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,(entry->entry).name,&local_159);
  switch(TVar1) {
  case Bool:
    cVar2 = (**(code **)(*(long *)local_158._M_ptr + 0x50))
                      (local_158._M_ptr,local_128,entry->defaultValue);
    if (cVar2 != '\0') {
      __s = "true";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,__s,local_148);
    break;
  case Int:
    iVar3 = (**(code **)(*(long *)local_158._M_ptr + 0x58))
                      (local_158._M_ptr,local_128,entry[1].entry.type);
    std::__cxx11::to_string(&local_108,iVar3);
    break;
  case Double:
    iVar3 = *(int *)&entry[1].entry.name;
    value = (double)(**(code **)(*(long *)local_158._M_ptr + 0x60))
                              ((int)*(undefined8 *)&entry[1].defaultValue,local_158._M_ptr,local_128
                              );
    stringValueForDouble_abi_cxx11_(&local_108,value,iVar3);
    break;
  case String:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_148,*(char **)&entry->defaultValue,&local_15a);
    (**(code **)(*(long *)local_158._M_ptr + 0x68))(&local_108,local_158._M_ptr,local_128,local_148)
    ;
    goto LAB_0018c4d8;
  case Enum:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_148,entry[1].entry.name,&local_15a);
    (**(code **)(*(long *)local_158._M_ptr + 0x68))(&local_108,local_158._M_ptr,local_128,local_148)
    ;
LAB_0018c4d8:
    std::__cxx11::string::~string((string *)local_148);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid type passed to stringValueFor!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string((string *)local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d8 = (code *)0x0;
  pcStack_d0 = (code *)0x0;
  this = (__0 *)operator_new(0x50);
  ShowBoolOverlay(f8n::sdk::ISchema::BoolEntry_const*,std::shared_ptr<f8n::prefs::Preferences>,std::function<void(std::__cxx11::string)>)
  ::$_0::__0(this,&handler);
  pcStack_d0 = std::
               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:283:20)>
               ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:283:20)>
             ::_M_manager;
  local_e8._M_unused._0_8_ = (undefined8)this;
  ShowListOverlay(&name,&items,&local_108,
                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  ShowBoolOverlay(f8n::sdk::ISchema::BoolEntry_const*,std::shared_ptr<f8n::prefs::Preferences>,std::function<void(std::__cxx11::string)>)
  ::$_0::~__0((__0 *)&handler);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&items);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void SchemaOverlay::ShowBoolOverlay(
    const ISchema::BoolEntry* entry,
    PrefsPtr prefs,
    std::function<void(std::string)> callback)
{
    std::string name(entry->entry.name);
    std::vector<std::string> items = { "true", "false" };

    auto handler = [prefs, name, callback](std::string value) {
        prefs->SetBool(name, value == "true");
        if (callback) { callback(value); }
    };

    ShowListOverlay(name, items, stringValueFor(prefs, entry), handler);
}